

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

bool __thiscall AbstractModuleClient::initializeHardwareConnection(AbstractModuleClient *this)

{
  bool bVar1;
  TrodesMsg m;
  string local_58;
  TrodesMsg local_38;
  
  MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","HUPD");
  bVar1 = MlmWrap::init_hardware_connection(&this->super_MlmWrap);
  if (bVar1) {
    TrodesMsg::TrodesMsg(&local_38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s","");
    TrodesMsg::addcontents<char_const*>(&local_38,&local_58,"GETSETTINGS");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_38);
    TrodesMsg::~TrodesMsg(&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AbstractModuleClient::initializeHardwareConnection(){
    subscribeStream(TRODES_NETWORK_ID, hardware_update);
    if(init_hardware_connection()){
        //success, ask for hardware settings.
        TrodesMsg m;
        m.addcontents("s", "GETSETTINGS");
        if(sendHardwareMessage(m)){
            //success with get settings
            return true;
        }
        else{
            return false;
        }
    }
    else{
        return false;
    }
}